

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

void __thiscall chatra::TransferRequest::restore(TransferRequest *this,Reader *r)

{
  Reference local_20;
  Reader *local_18;
  Reader *r_local;
  TransferRequest *this_local;
  
  local_18 = r;
  r_local = (Reader *)this;
  Reader::in<chatra::Requester>(r,&this->requester);
  local_20 = Reader::readReference(local_18);
  Reference::operator=(&this->ref,&local_20);
  Reader::in<chatra::LockType>(local_18,&this->lockType);
  return;
}

Assistant:

void TransferRequest::restore(Reader& r) {
	r.in(requester);
	ref = r.readReference();
	r.in(lockType);
}